

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Struct2Local::visitStructRMW(Struct2Local *this,StructRMW *curr)

{
  Index index;
  ParentChildInteraction PVar1;
  bool bVar2;
  BinaryOp op;
  reference pvVar3;
  Drop *left;
  LocalSet *pLVar4;
  ExpressionList *pEVar5;
  LocalGet *pLVar6;
  LocalGet *right;
  optional<wasm::Type> type_00;
  Op local_8c;
  Op binop;
  Binary *local_80;
  Expression *newVal;
  optional<wasm::Type> local_68;
  Block *local_58;
  Block *block;
  uintptr_t uStack_48;
  value_type local;
  Index local_3c;
  uintptr_t uStack_38;
  Index valScratch;
  Index local_2c;
  Type TStack_28;
  Index oldScratch;
  Type type;
  value_type *field;
  StructRMW *curr_local;
  Struct2Local *this_local;
  
  PVar1 = EscapeAnalyzer::getInteraction(this->analyzer,(Expression *)curr);
  if (PVar1 != None) {
    type.id = (uintptr_t)
              std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                        (this->fields,(ulong)curr->index);
    TStack_28.id = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.
                   id;
    bVar2 = wasm::Type::operator==(&stack0xffffffffffffffd8,(Type *)type.id);
    if (!bVar2) {
      __assert_fail("type == field.type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                    ,0x38b,
                    "void wasm::(anonymous namespace)::Struct2Local::visitStructRMW(StructRMW *)");
    }
    bVar2 = Field::isPacked((Field *)type.id);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!field.isPacked()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                    ,0x38c,
                    "void wasm::(anonymous namespace)::Struct2Local::visitStructRMW(StructRMW *)");
    }
    uStack_38 = TStack_28.id;
    local_2c = Builder::addVar(this->func,TStack_28);
    uStack_48 = TStack_28.id;
    local_3c = Builder::addVar(this->func,TStack_28);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->localIndexes,(ulong)curr->index);
    block._4_4_ = *pvVar3;
    left = Builder::makeDrop(&this->builder,curr->ref);
    pLVar4 = Builder::makeLocalSet(&this->builder,local_3c,curr->value);
    std::optional<wasm::Type>::optional(&local_68);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_68.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_68.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    local_58 = Builder::makeSequence(&this->builder,(Expression *)left,(Expression *)pLVar4,type_00)
    ;
    index = local_2c;
    pEVar5 = &local_58->list;
    pLVar6 = Builder::makeLocalGet(&this->builder,block._4_4_,TStack_28);
    pLVar4 = Builder::makeLocalSet(&this->builder,index,(Expression *)pLVar6);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar5->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pLVar4);
    if (curr->op == RMWXchg) {
      local_80 = (Binary *)Builder::makeLocalGet(&this->builder,local_3c,TStack_28);
    }
    else {
      local_8c = Add;
      switch(curr->op) {
      case RMWAdd:
        local_8c = Add;
        break;
      case RMWSub:
        local_8c = Sub;
        break;
      case RMWAnd:
        local_8c = And;
        break;
      case RMWOr:
        local_8c = Or;
        break;
      case RMWXor:
        local_8c = Xor;
      }
      op = Abstract::getBinary(TStack_28,local_8c);
      pLVar6 = Builder::makeLocalGet(&this->builder,block._4_4_,TStack_28);
      right = Builder::makeLocalGet(&this->builder,local_3c,TStack_28);
      local_80 = Builder::makeBinary(&this->builder,op,(Expression *)pLVar6,(Expression *)right);
    }
    pEVar5 = &local_58->list;
    pLVar4 = Builder::makeLocalSet(&this->builder,block._4_4_,(Expression *)local_80);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar5->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pLVar4);
    pEVar5 = &local_58->list;
    pLVar6 = Builder::makeLocalGet(&this->builder,local_2c,TStack_28);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar5->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pLVar6);
    (local_58->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
         TStack_28.id;
    replaceCurrent(this,(Expression *)local_58);
  }
  return;
}

Assistant:

void visitStructRMW(StructRMW* curr) {
    if (analyzer.getInteraction(curr) == ParentChildInteraction::None) {
      return;
    }

    [[maybe_unused]] auto& field = fields[curr->index];
    auto type = curr->type;
    assert(type == field.type);
    assert(!field.isPacked());

    // We need a scratch local to hold the old, unmodified field value while we
    // update the original local with the modified value. We also need another
    // scratch local to hold the evaluated modification value while we set the
    // first scratch local in case the evaluation of the modification value ends
    // up changing the field value. This is similar to the scratch locals used
    // for struct.new.
    auto oldScratch = builder.addVar(func, type);
    auto valScratch = builder.addVar(func, type);
    auto local = localIndexes[curr->index];

    auto* block =
      builder.makeSequence(builder.makeDrop(curr->ref),
                           builder.makeLocalSet(valScratch, curr->value));

    // Stash the old value to return.
    block->list.push_back(
      builder.makeLocalSet(oldScratch, builder.makeLocalGet(local, type)));

    // Store the updated value.
    Expression* newVal = nullptr;
    if (curr->op == RMWXchg) {
      newVal = builder.makeLocalGet(valScratch, type);
    } else {
      Abstract::Op binop = Abstract::Add;
      switch (curr->op) {
        case RMWAdd:
          binop = Abstract::Add;
          break;
        case RMWSub:
          binop = Abstract::Sub;
          break;
        case RMWAnd:
          binop = Abstract::And;
          break;
        case RMWOr:
          binop = Abstract::Or;
          break;
        case RMWXor:
          binop = Abstract::Xor;
          break;
        case RMWXchg:
          WASM_UNREACHABLE("unexpected op");
      }
      newVal = builder.makeBinary(Abstract::getBinary(type, binop),
                                  builder.makeLocalGet(local, type),
                                  builder.makeLocalGet(valScratch, type));
    }
    block->list.push_back(builder.makeLocalSet(local, newVal));

    // Unstash the old value.
    block->list.push_back(builder.makeLocalGet(oldScratch, type));
    block->type = type;
    replaceCurrent(block);
  }